

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_by_name.hpp
# Opt level: O2

void __thiscall
duckdb::UnionByReaderTask<duckdb::ParquetMultiFileInfo,_duckdb::ParquetOptions>::ExecuteTask
          (UnionByReaderTask<duckdb::ParquetMultiFileInfo,_duckdb::ParquetOptions> *this)

{
  reference this_00;
  shared_ptr<duckdb::BaseFileReader,_true> reader;
  shared_ptr<duckdb::BaseUnionData,_true> sStack_48;
  shared_ptr<duckdb::BaseFileReader,_true> local_38;
  element_type *local_28;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  ParquetMultiFileInfo::CreateReader
            ((ClientContext *)&stack0xffffffffffffffd8,(OpenFileInfo *)this->context,
             (ParquetOptions *)this->file,(MultiFileOptions *)this->options);
  local_38.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_28;
  local_38.internal.super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_20._M_pi;
  local_28 = (element_type *)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ParquetMultiFileInfo::GetUnionData((ParquetMultiFileInfo *)&sStack_48,&local_38,this->file_idx);
  this_00 = vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_true>::get<true>
                      (this->readers,this->file_idx);
  shared_ptr<duckdb::BaseUnionData,_true>::operator=(this_00,&sStack_48);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_48.internal.
              super___shared_ptr<duckdb::BaseUnionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.internal.
              super___shared_ptr<duckdb::BaseFileReader,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void ExecuteTask() override {
		auto reader = OP::CreateReader(context, file, options, file_options);
		readers[file_idx] = OP::GetUnionData(std::move(reader), file_idx);
	}